

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::ReferenceContext::blendFunc(ReferenceContext *this,deUint32 src,deUint32 dst)

{
  bool bVar1;
  deBool dVar2;
  deUint32 dst_local;
  deUint32 src_local;
  ReferenceContext *this_local;
  
  while ((bVar1 = isValidBlendFactor(src), bVar1 && (bVar1 = isValidBlendFactor(dst), bVar1))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      this->m_blendFactorSrcRGB = src;
      this->m_blendFactorSrcAlpha = src;
      this->m_blendFactorDstRGB = dst;
      this->m_blendFactorDstAlpha = dst;
      return;
    }
  }
  setError(this,0x500);
  return;
}

Assistant:

void ReferenceContext::blendFunc (deUint32 src, deUint32 dst)
{
	RC_IF_ERROR(!isValidBlendFactor(src) ||
				!isValidBlendFactor(dst),
				GL_INVALID_ENUM, RC_RET_VOID);

	m_blendFactorSrcRGB		= src;
	m_blendFactorSrcAlpha	= src;
	m_blendFactorDstRGB		= dst;
	m_blendFactorDstAlpha	= dst;
}